

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::GatherGLSLCompile::Run(GatherGLSLCompile *this)

{
  bool bVar1;
  GLuint GVar2;
  char *src_vs;
  char *src_fs;
  string local_58 [32];
  string local_38 [32];
  GatherGLSLCompile *local_18;
  GatherGLSLCompile *this_local;
  
  local_18 = this;
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xb])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc])(local_58);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = TGBase::CreateProgram(&this->super_TGBase,src_vs,src_fs);
  this->program = GVar2;
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->program);
  bVar1 = TGBase::CheckProgram(&this->super_TGBase,this->program,(bool *)0x0);
  if (bVar1) {
    this_local = (GatherGLSLCompile *)0x0;
  }
  else {
    this_local = (GatherGLSLCompile *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str());
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		return NO_ERROR;
	}